

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popthelp.c
# Opt level: O0

void singleOptionHelp(FILE *fp,columns_t columns,poptOption *opt,char *translation_domain)

{
  size_t sVar1;
  char cVar2;
  uint uVar3;
  char *lineLength_00;
  char *pcVar4;
  ushort **ppuVar5;
  size_t sVar6;
  char *pcVar7;
  char *__dest;
  size_t sVar8;
  bool bVar9;
  char local_100;
  size_t local_f0;
  char *local_e0;
  char *fmthelp;
  char *ch;
  char *leo;
  char *te;
  char *t;
  char *le;
  char *toggle;
  char *longName;
  char *dash_1;
  char *dash;
  size_t sStack_78;
  int displaypad;
  size_t nb;
  char *left;
  char *defs;
  size_t helpLength;
  int prtshort;
  char *argDescrip;
  char *help;
  size_t lineLength;
  size_t indentLength;
  size_t maxLeftCol;
  char *translation_domain_local;
  poptOption *opt_local;
  columns_t columns_local;
  FILE *fp_local;
  
  sVar1 = columns->cur;
  lineLength_00 = (char *)(columns->max - (sVar1 + 5));
  argDescrip = opt->descrip;
  pcVar4 = getArgDescrip(opt,translation_domain);
  ppuVar5 = __ctype_b_loc();
  bVar9 = false;
  if (((*ppuVar5)[(int)opt->shortName] & 0x4000) != 0) {
    bVar9 = opt->shortName != ' ';
  }
  left = (char *)0x0;
  sStack_78 = sVar1 + 1;
  dash._4_4_ = 0;
  if (opt->longName != (char *)0x0) {
    sVar6 = strlen(opt->longName);
    sStack_78 = sVar6 + sStack_78;
  }
  if ((opt->argInfo & 0x200000) != 0) {
    sStack_78 = sStack_78 + 4;
  }
  if (pcVar4 != (char *)0x0) {
    sVar6 = strlen(pcVar4);
    sStack_78 = sVar6 + sStack_78;
  }
  nb = (size_t)malloc(sStack_78);
  if ((char *)nb != (char *)0x0) {
    *(char *)nb = '\0';
    *(char *)(nb + sVar1) = '\0';
    if ((bVar9) || (opt->longName != (char *)0x0)) {
      if ((bVar9) && (opt->longName != (char *)0x0)) {
        pcVar7 = "--";
        if ((opt->argInfo & 0x80000000) != 0) {
          pcVar7 = "-";
        }
        *(char *)nb = '-';
        *(char *)(nb + 1) = opt->shortName;
        __dest = stpcpy((char *)(nb + 2),", ");
        pcVar7 = stpcpy(__dest,pcVar7);
        stpcpy(pcVar7,opt->longName);
      }
      else if (bVar9) {
        *(char *)nb = '-';
        *(char *)(nb + 1) = opt->shortName;
        *(char *)(nb + 2) = '\0';
      }
      else if (opt->longName != (char *)0x0) {
        if ((opt->argInfo & _poptArgMask) == 0x1b) {
          local_e0 = "";
        }
        else {
          local_e0 = "--";
          if ((opt->argInfo & 0x80000000) != 0) {
            local_e0 = "-";
          }
        }
        pcVar7 = opt->longName;
        toggle = pcVar7;
        if ((opt->argInfo & 0x200000) == 0) {
          le = "";
        }
        else {
          le = "[no]";
          if (((*pcVar7 == 'n') && (pcVar7[1] == 'o')) && (toggle = pcVar7 + 2, *toggle == '-')) {
            toggle = pcVar7 + 3;
          }
        }
        pcVar7 = stpcpy((char *)nb,"    ");
        pcVar7 = stpcpy(pcVar7,local_e0);
        pcVar7 = stpcpy(pcVar7,le);
        stpcpy(pcVar7,toggle);
      }
      if (pcVar4 != (char *)0x0) {
        sVar6 = strlen((char *)nb);
        pcVar7 = (char *)(nb + sVar6);
        t = pcVar7;
        if ((opt->argInfo & 0x10000000) != 0) {
          t = pcVar7 + 1;
          *pcVar7 = '[';
        }
        if (((opt->argInfo & 0x800000) != 0) &&
           (left = singleOptionDefaultValue((size_t)lineLength_00,opt,translation_domain),
           left != (char *)0x0)) {
          if (argDescrip == (char *)0x0) {
            local_f0 = 0;
          }
          else {
            local_f0 = strlen(argDescrip);
          }
          sVar6 = strlen(left);
          pcVar7 = (char *)malloc(local_f0 + sVar6 + 2);
          if (pcVar7 != (char *)0x0) {
            leo = pcVar7;
            if (argDescrip != (char *)0x0) {
              leo = stpcpy(pcVar7,argDescrip);
            }
            *leo = ' ';
            strcpy(leo + 1,left);
            _free(left);
            left = pcVar7;
          }
        }
        if (opt->argDescrip == (char *)0x0) {
          uVar3 = opt->argInfo & _poptArgMask;
          if ((uVar3 != 0) &&
             ((uVar3 - 1 < 3 || ((uVar3 != 7 && ((uVar3 - 8 < 3 || (uVar3 == 0xd)))))))) {
            cVar2 = ' ';
            if (opt->longName != (char *)0x0) {
              cVar2 = '=';
            }
            *t = cVar2;
            t = stpcpy(t + 1,pcVar4);
          }
        }
        else {
          pcVar7 = strchr(" =(",(int)*pcVar4);
          if (pcVar7 == (char *)0x0) {
            if ((opt->argInfo & _poptArgMask) == 0x1b) {
              local_100 = ' ';
            }
            else if ((opt->argInfo & _poptArgMask) == 0xc) {
              local_100 = ' ';
            }
            else {
              local_100 = '=';
              if (opt->longName == (char *)0x0) {
                local_100 = ' ';
              }
            }
            *t = local_100;
            t = t + 1;
          }
          pcVar7 = stpcpy(t,pcVar4);
          sVar8 = stringDisplayWidth(pcVar4);
          dash._4_4_ = ((int)pcVar7 - (int)t) - (int)sVar8;
          t = pcVar7;
        }
        if ((opt->argInfo & 0x10000000) != 0) {
          *t = ']';
          t = t + 1;
        }
        *t = '\0';
      }
      if (argDescrip == (char *)0x0) {
        POPT_fprintf(fp,"  %s\n",nb);
      }
      else {
        POPT_fprintf(fp,"  %-*s   ",(ulong)(uint)((int)sVar1 + dash._4_4_),nb);
        nb = (size_t)_free((void *)nb);
        if (left != (char *)0x0) {
          argDescrip = left;
        }
        defs = (char *)strlen(argDescrip);
        while (lineLength_00 < defs) {
          fmthelp = argDescrip + (long)lineLength_00 + -1;
          while( true ) {
            bVar9 = false;
            if (argDescrip < fmthelp) {
              ppuVar5 = __ctype_b_loc();
              bVar9 = ((*ppuVar5)[(int)(uint)(byte)*fmthelp] & 0x2000) == 0;
            }
            if (!bVar9) break;
            fmthelp = POPT_prev_char(fmthelp);
          }
          if (fmthelp == argDescrip) break;
          while( true ) {
            bVar9 = false;
            if (argDescrip + 1 < fmthelp) {
              ppuVar5 = __ctype_b_loc();
              bVar9 = ((*ppuVar5)[(int)(uint)(byte)*fmthelp] & 0x2000) != 0;
            }
            if (!bVar9) break;
            fmthelp = POPT_prev_char(fmthelp);
          }
          pcVar4 = POPT_next_char(fmthelp);
          sVar6 = strlen(argDescrip);
          pcVar7 = (char *)malloc(sVar6 + 1);
          if (pcVar7 == (char *)0x0) {
            fprintf(_stderr,"virtual memory exhausted.\n");
            exit(1);
          }
          pcVar7 = strcpy(pcVar7,argDescrip);
          if (pcVar7 != (char *)0x0) {
            pcVar7[(long)pcVar4 - (long)argDescrip] = '\0';
            POPT_fprintf(fp,"%s\n%*s",pcVar7,sVar1 + 5 & 0xffffffff," ");
            free(pcVar7);
          }
          while( true ) {
            argDescrip = pcVar4;
            ppuVar5 = __ctype_b_loc();
            bVar9 = false;
            if (((*ppuVar5)[(int)(uint)(byte)*argDescrip] & 0x2000) != 0) {
              bVar9 = *argDescrip != '\0';
            }
            if (!bVar9) break;
            pcVar4 = POPT_next_char(argDescrip);
          }
          defs = (char *)strlen(argDescrip);
        }
        if (defs != (char *)0x0) {
          fprintf((FILE *)fp,"%s\n",argDescrip);
        }
      }
    }
    _free(left);
    _free((void *)nb);
  }
  return;
}

Assistant:

static void singleOptionHelp(FILE * fp, columns_t columns,
		const struct poptOption * opt,
		const char * translation_domain)
{
    size_t maxLeftCol = columns->cur;
    size_t indentLength = maxLeftCol + 5;
    size_t lineLength = columns->max - indentLength;
    const char * help = D_(translation_domain, opt->descrip);
    const char * argDescrip = getArgDescrip(opt, translation_domain);
    /* Display shortName iff printable non-space. */
    int prtshort = (int)(isprint((int)opt->shortName) && opt->shortName != ' ');
    size_t helpLength;
    char * defs = NULL;
    char * left;
    size_t nb = maxLeftCol + 1;
    int displaypad = 0;

    /* Make sure there's more than enough room in target buffer. */
    if (opt->longName)	nb += strlen(opt->longName);
    if (F_ISSET(opt, TOGGLE)) nb += sizeof("[no]") - 1;
    if (argDescrip)	nb += strlen(argDescrip);

    left = malloc(nb);
    if (left == NULL) return;	/* XXX can't happen */
    left[0] = '\0';
    left[maxLeftCol] = '\0';

#define	prtlong	(opt->longName != NULL)	/* XXX splint needs a clue */
    if (!(prtshort || prtlong))
	goto out;
    if (prtshort && prtlong) {
	const char *dash = F_ISSET(opt, ONEDASH) ? "-" : "--";
	left[0] = '-';
	left[1] = opt->shortName;
	(void) stpcpy(stpcpy(stpcpy(left+2, ", "), dash), opt->longName);
    } else if (prtshort) {
	left[0] = '-';
	left[1] = opt->shortName;
	left[2] = '\0';
    } else if (prtlong) {
	/* XXX --long always padded for alignment with/without "-X, ". */
	const char *dash = poptArgType(opt) == POPT_ARG_MAINCALL ? ""
			 : (F_ISSET(opt, ONEDASH) ? "-" : "--");
	const char *longName = opt->longName;
	const char *toggle;
	if (F_ISSET(opt, TOGGLE)) {
	    toggle = "[no]";
	    if (longName[0] == 'n' && longName[1] == 'o') {
		longName += sizeof("no") - 1;
		if (longName[0] == '-')
		    longName++;
	    }
	} else
	    toggle = "";
	(void) stpcpy(stpcpy(stpcpy(stpcpy(left, "    "), dash), toggle), longName);
    }
#undef	prtlong

    if (argDescrip) {
	char * le = left + strlen(left);

	if (F_ISSET(opt, OPTIONAL))
	    *le++ = '[';

	/* Choose type of output */
	if (F_ISSET(opt, SHOW_DEFAULT)) {
	    defs = singleOptionDefaultValue(lineLength, opt, translation_domain);
	    if (defs) {
		char * t = malloc((help ? strlen(help) : 0) +
				strlen(defs) + sizeof(" "));
		if (t) {
		    char * te = t;
		    if (help)
			te = stpcpy(te, help);
		    *te++ = ' ';
		    strcpy(te, defs);
		    defs = _free(defs);
		    defs = t;
		}
	    }
	}

	if (opt->argDescrip == NULL) {
	    switch (poptArgType(opt)) {
	    case POPT_ARG_NONE:
		break;
	    case POPT_ARG_VAL:
#ifdef	NOTNOW	/* XXX pug ugly nerdy output */
	    {	long aLong = opt->val;
		int ops = F_ISSET(opt, LOGICALOPS);
		int negate = F_ISSET(opt, NOT);

		/* Don't bother displaying typical values */
		if (!ops && (aLong == 0L || aLong == 1L || aLong == -1L))
		    break;
		*le++ = '[';
		switch (ops) {
		case POPT_ARGFLAG_OR:
		    *le++ = '|';
		    break;
		case POPT_ARGFLAG_AND:
		    *le++ = '&';
		    break;
		case POPT_ARGFLAG_XOR:
		    *le++ = '^';
		    break;
		default:
		    break;
		}
		*le++ = (opt->longName != NULL ? '=' : ' ');
		if (negate) *le++ = '~';
		le += sprintf(le, (ops ? "0x%lx" : "%ld"), aLong);
		*le++ = ']';
	    }
#endif
		break;
	    case POPT_ARG_INT:
	    case POPT_ARG_SHORT:
	    case POPT_ARG_LONG:
	    case POPT_ARG_LONGLONG:
	    case POPT_ARG_FLOAT:
	    case POPT_ARG_DOUBLE:
	    case POPT_ARG_STRING:
		*le++ = (opt->longName != NULL ? '=' : ' ');
		le = stpcpy(le, argDescrip);
		break;
	    default:
		break;
	    }
	} else {
	    char *leo;

	    /* XXX argDescrip[0] determines "--foo=bar" or "--foo bar". */
	    if (!strchr(" =(", argDescrip[0]))
		*le++ = ((poptArgType(opt) == POPT_ARG_MAINCALL) ? ' ' :
			 (poptArgType(opt) == POPT_ARG_ARGV) ? ' ' :
			 opt->longName == NULL ? ' ' : '=');
	    le = stpcpy(leo = le, argDescrip);

	    /* Adjust for (possible) wide characters. */
	    displaypad = (int)((le - leo) - stringDisplayWidth(argDescrip));
	}
	if (F_ISSET(opt, OPTIONAL))
	    *le++ = ']';
	*le = '\0';
    }

    if (help)
	POPT_fprintf(fp,"  %-*s   ", (int)(maxLeftCol+displaypad), left);
    else {
	POPT_fprintf(fp,"  %s\n", left);
	goto out;
    }

    left = _free(left);
    if (defs)
	help = defs;

    helpLength = strlen(help);
    while (helpLength > lineLength) {
	const char * ch;

	ch = help + lineLength - 1;
	while (ch > help && !_isspaceptr(ch))
	    ch = POPT_prev_char(ch);
	if (ch == help) break;		/* give up */
	while (ch > (help + 1) && _isspaceptr(ch))
	    ch = POPT_prev_char (ch);
	ch = POPT_next_char(ch);

	/*
	 *  XXX strdup is necessary to add NUL terminator so that an unknown
	 *  no. of (possible) multi-byte characters can be displayed.
	 */
	{   char * fmthelp = xstrdup(help);
	    if (fmthelp) {
		fmthelp[ch - help] = '\0';
		POPT_fprintf(fp, "%s\n%*s", fmthelp, (int) indentLength, " ");
		free(fmthelp);
	    }
	}

	help = ch;
	while (_isspaceptr(help) && *help)
	    help = POPT_next_char(help);
	helpLength = strlen(help);
    }

    if (helpLength) fprintf(fp, "%s\n", help);
    help = NULL;

out:
    defs = _free(defs);
    left = _free(left);
}